

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::isWordBoundary(RegexMatcher *this,int64_t pos)

{
  UChar *pUVar1;
  UBool UVar2;
  int8_t iVar3;
  long lVar4;
  int iVar5;
  uint local_5c;
  long local_58;
  uint local_4c;
  byte local_35;
  UChar32 prevChar;
  UBool prevCIsWord;
  UChar32 c;
  int64_t __offset;
  UBool cIsWord;
  UBool isBoundary;
  int64_t pos_local;
  RegexMatcher *this_local;
  
  __offset._6_1_ = 0;
  if (pos < this->fLookLimit) {
    lVar4 = pos - this->fInputText->chunkNativeStart;
    if (((lVar4 < 0) || (this->fInputText->nativeIndexingLimit <= lVar4)) ||
       (0xdbff < (ushort)this->fInputText->chunkContents[lVar4])) {
      utext_setNativeIndex_63(this->fInputText,pos);
    }
    else {
      this->fInputText->chunkOffset = (int32_t)lVar4;
    }
    if ((this->fInputText->chunkOffset < this->fInputText->chunkLength) &&
       ((ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset] < 0xd800)) {
      local_4c = (uint)(ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset];
    }
    else {
      local_4c = utext_current32_63(this->fInputText);
    }
    UVar2 = u_hasBinaryProperty_63(local_4c,UCHAR_GRAPHEME_EXTEND);
    if ((UVar2 != '\0') || (iVar3 = u_charType_63(local_4c), iVar3 == '\x10')) {
      return '\0';
    }
    __offset._6_1_ = UnicodeSet::contains(this->fPattern->fStaticSets[1],local_4c);
  }
  else {
    this->fHitEnd = '\x01';
  }
  local_35 = 0;
  do {
    if (this->fInputText->nativeIndexingLimit < this->fInputText->chunkOffset) {
      local_58 = (*this->fInputText->pFuncs->mapOffsetToNative)(this->fInputText);
    }
    else {
      local_58 = this->fInputText->chunkNativeStart + (long)this->fInputText->chunkOffset;
    }
    if (local_58 <= this->fLookStart) goto LAB_0017d89a;
    if ((this->fInputText->chunkOffset < 1) ||
       (0xd7ff < (ushort)this->fInputText->chunkContents[this->fInputText->chunkOffset + -1])) {
      local_5c = utext_previous32_63(this->fInputText);
    }
    else {
      pUVar1 = this->fInputText->chunkContents;
      iVar5 = this->fInputText->chunkOffset + -1;
      this->fInputText->chunkOffset = iVar5;
      local_5c = (uint)(ushort)pUVar1[iVar5];
    }
    UVar2 = u_hasBinaryProperty_63(local_5c,UCHAR_GRAPHEME_EXTEND);
  } while ((UVar2 != '\0') || (iVar3 = u_charType_63(local_5c), iVar3 == '\x10'));
  local_35 = UnicodeSet::contains(this->fPattern->fStaticSets[1],local_5c);
LAB_0017d89a:
  return __offset._6_1_ ^ local_35;
}

Assistant:

UBool RegexMatcher::isWordBoundary(int64_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UTEXT_SETNATIVEINDEX(fInputText, pos);
        UChar32  c = UTEXT_CURRENT32(fInputText);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (UTEXT_GETNATIVEINDEX(fInputText) <= fLookStart) {
            break;
        }
        UChar32 prevChar = UTEXT_PREVIOUS32(fInputText);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}